

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_splice_list_move_Test::TestBody(IntrusiveListTest_splice_list_move_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_fffffffffffffd88;
  allocator<int> local_265;
  int local_264 [9];
  iterator local_240;
  size_type local_238;
  vector<int,_std::allocator<int>_> local_230;
  allocator<int> local_215;
  int local_214;
  iterator local_210;
  size_type local_208;
  vector<int,_std::allocator<int>_> local_200;
  TestObjectList local_1e8;
  iterator local_1d0;
  iterator local_1c0;
  allocator<int> local_1a9;
  int local_1a8 [8];
  iterator local_188;
  size_type local_180;
  vector<int,_std::allocator<int>_> local_178;
  allocator<int> local_15d;
  int local_15c [3];
  iterator local_150;
  size_type local_148;
  vector<int,_std::allocator<int>_> local_140;
  TestObjectList local_128;
  iterator local_110;
  allocator<int> local_fd;
  int local_fc [5];
  iterator local_e8;
  size_type local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  allocator<int> local_b9;
  int local_b8 [2];
  iterator local_b0;
  size_type local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  TestObjectList local_88;
  iterator local_70;
  allocator<int> local_5d;
  int local_5c [3];
  iterator local_50;
  size_type local_48;
  vector<int,_std::allocator<int>_> local_40;
  undefined1 local_28 [8];
  TestObjectList list1;
  IntrusiveListTest_splice_list_move_Test *this_local;
  
  local_5c[0] = 1;
  local_5c[1] = 2;
  local_5c[2] = 3;
  local_50 = local_5c;
  local_48 = 3;
  list1.size_ = (size_t)this;
  std::allocator<int>::allocator(&local_5d);
  __l_05._M_len = local_48;
  __l_05._M_array = local_50;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l_05,&local_5d);
  anon_unknown.dwarf_4f553::IntrusiveListTest::NewList
            ((TestObjectList *)local_28,&this->super_IntrusiveListTest,&local_40);
  std::vector<int,_std::allocator<int>_>::~vector(&local_40);
  std::allocator<int>::~allocator(&local_5d);
  local_70 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_b8[0] = 100;
  local_b8[1] = 200;
  local_b0 = local_b8;
  local_a8 = 2;
  std::allocator<int>::allocator(&local_b9);
  __l_04._M_len = local_a8;
  __l_04._M_array = local_b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l_04,&local_b9);
  anon_unknown.dwarf_4f553::IntrusiveListTest::NewList
            (&local_88,&this->super_IntrusiveListTest,&local_a0);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,(int)local_70.list_,
             (__off64_t *)local_70.node_,(int)&local_88,in_R8,in_R9,in_stack_fffffffffffffd88);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list(&local_88);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a0);
  std::allocator<int>::~allocator(&local_b9);
  local_fc[0] = 100;
  local_fc[1] = 200;
  local_fc[2] = 1;
  local_fc[3] = 2;
  local_fc[4] = 3;
  local_e8 = local_fc;
  local_e0 = 5;
  std::allocator<int>::allocator(&local_fd);
  __l_03._M_len = local_e0;
  __l_03._M_array = local_e8;
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l_03,&local_fd);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_d8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_d8);
  std::allocator<int>::~allocator(&local_fd);
  local_110 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_15c[0] = 500;
  local_15c[1] = 600;
  local_15c[2] = 700;
  local_150 = local_15c;
  local_148 = 3;
  std::allocator<int>::allocator(&local_15d);
  __l_02._M_len = local_148;
  __l_02._M_array = local_150;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_02,&local_15d);
  anon_unknown.dwarf_4f553::IntrusiveListTest::NewList
            (&local_128,&this->super_IntrusiveListTest,&local_140);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,(int)local_110.list_,
             (__off64_t *)local_110.node_,(int)&local_128,in_R8,in_R9,in_stack_fffffffffffffd88);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list(&local_128);
  std::vector<int,_std::allocator<int>_>::~vector(&local_140);
  std::allocator<int>::~allocator(&local_15d);
  local_1a8[0] = 100;
  local_1a8[1] = 200;
  local_1a8[2] = 1;
  local_1a8[3] = 2;
  local_1a8[4] = 3;
  local_1a8[5] = 500;
  local_1a8[6] = 600;
  local_1a8[7] = 700;
  local_188 = local_1a8;
  local_180 = 8;
  std::allocator<int>::allocator(&local_1a9);
  __l_01._M_len = local_180;
  __l_01._M_array = local_188;
  std::vector<int,_std::allocator<int>_>::vector(&local_178,__l_01,&local_1a9);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_178);
  std::vector<int,_std::allocator<int>_>::~vector(&local_178);
  std::allocator<int>::~allocator(&local_1a9);
  local_1d0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_1c0 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                        (local_1d0,4);
  local_214 = 400;
  local_210 = &local_214;
  local_208 = 1;
  std::allocator<int>::allocator(&local_215);
  __l_00._M_len = local_208;
  __l_00._M_array = local_210;
  std::vector<int,_std::allocator<int>_>::vector(&local_200,__l_00,&local_215);
  anon_unknown.dwarf_4f553::IntrusiveListTest::NewList
            (&local_1e8,&this->super_IntrusiveListTest,&local_200);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,(int)local_1c0.list_,
             (__off64_t *)local_1c0.node_,(int)&local_1e8,in_R8,in_R9,in_stack_fffffffffffffd88);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list(&local_1e8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_200);
  std::allocator<int>::~allocator(&local_215);
  memcpy(local_264,&DAT_004e60b4,0x24);
  local_240 = local_264;
  local_238 = 9;
  std::allocator<int>::allocator(&local_265);
  __l._M_len = local_238;
  __l._M_array = local_240;
  std::vector<int,_std::allocator<int>_>::vector(&local_230,__l,&local_265);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_230);
  std::vector<int,_std::allocator<int>_>::~vector(&local_230);
  std::allocator<int>::~allocator(&local_265);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, splice_list_move) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  list1.splice(list1.begin(), NewList({100, 200}));
  AssertListEq(list1, {100, 200, 1, 2, 3});

  // Splice at end.
  list1.splice(list1.end(), NewList({500, 600, 700}));
  AssertListEq(list1, {100, 200, 1, 2, 3, 500, 600, 700});

  // Splice in the middle.
  list1.splice(std::next(list1.begin(), 4), NewList({400}));
  AssertListEq(list1, {100, 200, 1, 2, 400, 3, 500, 600, 700});
}